

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

void isoent_remove_child(isoent *parent,isoent *child)

{
  long lVar1;
  archive_rb_node *paVar2;
  archive_rb_node *in_RSI;
  archive_rb_node *in_RDI;
  isoent *ent;
  archive_rb_node *local_18;
  
  for (local_18 = (archive_rb_node *)in_RDI[1].rb_info;
      *(archive_rb_node **)((long)local_18 + 0x70) != in_RSI;
      local_18 = *(archive_rb_node **)((long)local_18 + 0x70)) {
  }
  lVar1 = *(long *)(*(long *)((long)local_18 + 0x70) + 0x70);
  *(long *)((long)local_18 + 0x70) = lVar1;
  if (lVar1 == 0) {
    in_RDI[2].rb_nodes[0] = (archive_rb_node *)((long)local_18 + 0x70);
  }
  *(int *)(in_RDI[2].rb_nodes + 1) = *(int *)(in_RDI[2].rb_nodes + 1) + -1;
  if ((char)((char)in_RSI[9].rb_info << 6) < '\0') {
    for (local_18 = in_RDI[3].rb_nodes[1]; local_18[5].rb_nodes[0] != in_RSI;
        local_18 = local_18[5].rb_nodes[0]) {
    }
    paVar2 = local_18[5].rb_nodes[0][5].rb_nodes[0];
    local_18[5].rb_nodes[0] = paVar2;
    if (paVar2 == (archive_rb_node *)0x0) {
      in_RDI[3].rb_info = (uintptr_t)(local_18 + 5);
    }
    *(int *)in_RDI[4].rb_nodes = *(int *)in_RDI[4].rb_nodes + -1;
  }
  __archive_rb_tree_remove_node((archive_rb_tree *)ent,in_RDI);
  return;
}

Assistant:

static void
isoent_remove_child(struct isoent *parent, struct isoent *child)
{
	struct isoent *ent;

	/* Remove a child entry from children chain. */
	ent = parent->children.first;
	while (ent->chnext != child)
		ent = ent->chnext;
	if ((ent->chnext = ent->chnext->chnext) == NULL)
		parent->children.last = &(ent->chnext);
	parent->children.cnt--;

	if (child->dir) {
		/* Remove a child entry from sub-directory chain. */
		ent = parent->subdirs.first;
		while (ent->drnext != child)
			ent = ent->drnext;
		if ((ent->drnext = ent->drnext->drnext) == NULL)
			parent->subdirs.last = &(ent->drnext);
		parent->subdirs.cnt--;
	}

	__archive_rb_tree_remove_node(&(parent->rbtree),
	    (struct archive_rb_node *)child);
}